

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateInputOutputTypes
                   (Result *__return_storage_ptr__,
                   RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,
                   ResultReason reason,string *featureTypesDesc)

{
  int iVar1;
  Rep *pRVar2;
  RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription> RVar3;
  long *plVar4;
  size_type *psVar5;
  void **ppvVar6;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pRVar2 = (features->super_RepeatedPtrFieldBase).rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  iVar1 = (features->super_RepeatedPtrFieldBase).current_size_;
  RVar3 = std::
          __find_if<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,__gnu_cxx::__ops::_Iter_negate<CoreML::validateInputOutputTypes(google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>const&,CoreML::ResultReason,std::__cxx11::string_const&)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>>
                    (ppvVar6,ppvVar6 + iVar1);
  if (RVar3.it_ == ppvVar6 + iVar1) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::operator+(&local_40,"Neural Networks require ",featureTypesDesc);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = plVar4[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_60._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,reason,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputOutputTypes(const ::google::protobuf::RepeatedPtrField<Specification::FeatureDescription>& features,
                                       ResultReason reason,
                                       const std::string& featureTypesDesc) {
    auto checkFeatures = [&](const Specification::FeatureDescription& feature) {
        switch (feature.type().Type_case()) {
            case Specification::FeatureType::kImageType:
            case Specification::FeatureType::kMultiArrayType:
            case Specification::FeatureType::kStateType:
                return true;
            default:
                return false;
        }
    };

    if (!std::all_of(features.cbegin(), features.cend(), checkFeatures)) {
         return Result(ResultType::INVALID_MODEL_INTERFACE, reason,
                       "Neural Networks require " + featureTypesDesc + " to be images, MLMultiArray, or State.");
    }

    return Result();
}